

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O1

void __thiscall uWS::HttpResponse<true>::writeUnsignedHex(HttpResponse<true> *this,uint value)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  void *pvVar4;
  void *__buf;
  char buf [10];
  char temp [10];
  char local_14 [9];
  char acStack_b [11];
  
  __buf = (void *)0x0;
  uVar3 = (ulong)value;
  do {
    (acStack_b + 1)[(long)__buf] = "0123456789abcdef"[value & 0xf];
    uVar3 = uVar3 >> 4;
    __buf = (void *)((long)__buf + 1);
    bVar1 = 0xf < value;
    value = (uint)uVar3;
  } while (bVar1);
  pcVar2 = local_14;
  pvVar4 = __buf;
  do {
    *pcVar2 = acStack_b[(long)pvVar4];
    pcVar2 = pcVar2 + 1;
    pvVar4 = (void *)((long)pvVar4 + -1);
  } while (pvVar4 != (void *)0x0);
  AsyncSocket<true>::write((AsyncSocket<true> *)this,(int)local_14,__buf,0);
  return;
}

Assistant:

void writeUnsignedHex(unsigned int value) {
        char buf[10];
        int length = utils::u32toaHex(value, buf);

        /* For now we do this copy */
        Super::write(buf, length);
    }